

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__set_reuse(int fd)

{
  int iVar1;
  int *piVar2;
  undefined4 local_14;
  int local_10;
  int yes;
  int fd_local;
  
  local_14 = 1;
  local_10 = fd;
  iVar1 = setsockopt(fd,1,2,&local_14,4);
  if (iVar1 == 0) {
    yes = 0;
  }
  else {
    piVar2 = __errno_location();
    yes = -*piVar2;
  }
  return yes;
}

Assistant:

static int uv__set_reuse(int fd) {
  int yes;

#if defined(SO_REUSEPORT) && !defined(__linux__)
  yes = 1;
  if (setsockopt(fd, SOL_SOCKET, SO_REUSEPORT, &yes, sizeof(yes)))
    return -errno;
#else
  yes = 1;
  if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof(yes)))
    return -errno;
#endif

  return 0;
}